

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.h
# Opt level: O0

Mat * __thiscall ncnn::Mat::reshape(Mat *this,int _w,int _h,int _c,Allocator *_allocator)

{
  size_t sVar1;
  int in_ECX;
  ulong _elemsize;
  int in_EDX;
  Mat *in_RSI;
  Mat *in_RDI;
  int in_R8D;
  undefined8 in_R9;
  int _c_00;
  Mat tmp;
  void *mptr;
  void *ptr;
  int i;
  Mat *m;
  undefined8 in_stack_ffffffffffffff40;
  int _elempack;
  Mat *pMVar2;
  Allocator *in_stack_ffffffffffffff70;
  Allocator *in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff84;
  Mat *in_stack_ffffffffffffff88;
  int local_40;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd7;
  int in_stack_ffffffffffffffe0;
  
  _c_00 = (int)((ulong)in_R9 >> 0x20);
  _elempack = (int)((ulong)in_stack_ffffffffffffff40 >> 0x20);
  if (in_RSI->w * in_RSI->h * in_RSI->c == in_EDX * in_ECX * in_R8D) {
    pMVar2 = in_RDI;
    if (in_RSI->dims < 3) {
      _elemsize = (long)in_EDX * (long)in_ECX;
      sVar1 = ncnn::alignSize((long)(in_EDX * in_ECX) * in_RSI->elemsize,0x10);
      if (_elemsize != sVar1 / in_RSI->elemsize) {
        Mat(in_RDI);
        create(in_RSI,(int)((ulong)pMVar2 >> 0x20),(int)pMVar2,(int)((ulong)in_RDI >> 0x20),
               _elemsize,_elempack,in_stack_ffffffffffffff70);
        for (local_40 = 0; local_40 < in_R8D; local_40 = local_40 + 1) {
          memcpy((void *)((long)in_RDI->data + (long)local_40 * in_RDI->cstep * in_RDI->elemsize),
                 (void *)((long)in_RSI->data + (long)(local_40 * in_EDX * in_ECX) * in_RSI->elemsize
                         ),(long)(in_EDX * in_ECX) * in_RSI->elemsize);
        }
        return pMVar2;
      }
    }
    else if (in_RSI->c != in_R8D) {
      reshape(in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,in_stack_ffffffffffffff78);
      reshape((Mat *)CONCAT44(in_EDX,in_ECX),in_R8D,in_stack_ffffffffffffffe0,_c_00,
              (Allocator *)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0));
      ~Mat((Mat *)0x17d21c);
      return in_RDI;
    }
    Mat(in_RDI,in_RSI);
    in_RDI->dims = 3;
    in_RDI->w = in_EDX;
    in_RDI->h = in_ECX;
    in_RDI->c = in_R8D;
    sVar1 = ncnn::alignSize((long)(in_EDX * in_ECX) * in_RSI->elemsize,0x10);
    in_RDI->cstep = sVar1 / in_RSI->elemsize;
  }
  else {
    Mat(in_RDI);
    pMVar2 = in_RDI;
  }
  return pMVar2;
}

Assistant:

inline Mat Mat::reshape(int _w, int _h, int _c, Allocator* _allocator) const
{
    if (w * h * c != _w * _h * _c)
        return Mat();

    if (dims < 3)
    {
        if ((size_t)_w * _h != alignSize(_w * _h * elemsize, 16) / elemsize)
        {
            Mat m;
            m.create(_w, _h, _c, elemsize, elempack, _allocator);

            // align channel
            for (int i=0; i<_c; i++)
            {
                const void* ptr = (unsigned char*)data + i * _w * _h * elemsize;
                void* mptr = (unsigned char*)m.data + i * m.cstep * m.elemsize;
                memcpy(mptr, ptr, _w * _h * elemsize);
            }

            return m;
        }
    }
    else if (c != _c)
    {
        // flatten and then align
        Mat tmp = reshape(_w * _h * _c, _allocator);
        return tmp.reshape(_w, _h, _c, _allocator);
    }

    Mat m = *this;

    m.dims = 3;
    m.w = _w;
    m.h = _h;
    m.c = _c;

    m.cstep = alignSize(_w * _h * elemsize, 16) / elemsize;

    return m;
}